

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O0

void __thiscall
FIX::HttpConnection::processResetSession
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  bool bVar1;
  string *psVar2;
  SessionNotFound *this_00;
  ostream *poVar3;
  TAG *pTVar4;
  bool local_15a2;
  exception *e;
  string local_1508;
  undefined1 local_14e8 [8];
  A a_3;
  string local_1328;
  string local_1308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12e8;
  undefined1 local_12c8 [8];
  A a_2;
  CENTER center_2;
  string local_f38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f18;
  undefined1 local_ef8 [8];
  A a_1;
  H2 h2_1;
  CENTER center_1;
  string local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  undefined1 local_970 [8];
  A a;
  H2 h2;
  CENTER center;
  allocator<char> local_421;
  string local_420;
  byte local_3fb;
  byte local_3fa;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  byte local_3a9;
  undefined1 local_3a8 [7];
  bool confirm;
  undefined1 local_388 [8];
  string sessionUrl;
  string local_360;
  Session *local_340;
  Session *pSession;
  SessionID sessionID;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  undefined1 local_180 [8];
  string sessionQualifier;
  string local_158;
  undefined1 local_138 [8];
  string targetCompID;
  string local_110;
  undefined1 local_f0 [8];
  string senderCompID;
  string local_c8;
  undefined1 local_a8 [8];
  string beginString;
  undefined1 local_78 [8];
  HttpMessage copy;
  stringstream *b_local;
  stringstream *h_local;
  HttpMessage *request_local;
  HttpConnection *this_local;
  
  copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)b;
  HttpMessage::HttpMessage((HttpMessage *)local_78,request);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"BeginString",
             (allocator<char> *)(senderCompID.field_2._M_local_buf + 0xf));
  psVar2 = HttpMessage::getParameter(request,&local_c8);
  std::__cxx11::string::string((string *)local_a8,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)(senderCompID.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"SenderCompID",
             (allocator<char> *)(targetCompID.field_2._M_local_buf + 0xf));
  psVar2 = HttpMessage::getParameter(request,&local_110);
  std::__cxx11::string::string((string *)local_f0,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)(targetCompID.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"TargetCompID",
             (allocator<char> *)(sessionQualifier.field_2._M_local_buf + 0xf));
  psVar2 = HttpMessage::getParameter(request,&local_158);
  std::__cxx11::string::string((string *)local_138,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)(sessionQualifier.field_2._M_local_buf + 0xf))
  ;
  std::__cxx11::string::string((string *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"SessionQualifier",&local_1a1);
  bVar1 = HttpMessage::hasParameter((HttpMessage *)local_78,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"SessionQualifier",
               (allocator<char> *)(sessionID.m_frozenString.field_2._M_local_buf + 0xf));
    psVar2 = HttpMessage::getParameter((HttpMessage *)local_78,&local_1c8);
    std::__cxx11::string::operator=((string *)local_180,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(sessionID.m_frozenString.field_2._M_local_buf + 0xf));
  }
  SessionID::SessionID
            ((SessionID *)&pSession,(string *)local_a8,(string *)local_f0,(string *)local_138,
             (string *)local_180);
  local_340 = Session::lookupSession((SessionID *)&pSession);
  if (local_340 != (Session *)0x0) {
    HttpMessage::getParameterString_abi_cxx11_((string *)local_3a8,request);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,
                   "/session",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8);
    std::__cxx11::string::~string((string *)local_3a8);
    local_3a9 = 0;
    std::allocator<char>::allocator();
    local_3fa = 0;
    local_3fb = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"confirm",&local_3d1);
    bVar1 = HttpMessage::hasParameter((HttpMessage *)local_78,&local_3d0);
    local_15a2 = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_3fa = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"confirm",&local_3f9);
      local_3fb = 1;
      psVar2 = HttpMessage::getParameter((HttpMessage *)local_78,&local_3f8);
      local_15a2 = std::operator!=(psVar2,"0");
    }
    if ((local_3fb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_3f8);
    }
    if ((local_3fa & 1) != 0) {
      std::allocator<char>::~allocator(&local_3f9);
    }
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    if (local_15a2 != false) {
      local_3a9 = 1;
      Session::reset(local_340);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"confirm",&local_421);
      HttpMessage::removeParameter((HttpMessage *)local_78,&local_420);
      std::__cxx11::string::~string((string *)&local_420);
      std::allocator<char>::~allocator(&local_421);
    }
    if ((local_3a9 & 1) == 0) {
      HTML::CENTER::CENTER
                ((CENTER *)&h2_1.super_TAG.m_stream,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HTML::TAG::text((TAG *)&h2_1.super_TAG.m_stream);
      HTML::H2::H2((H2 *)&a_1.super_TAG.m_stream,
                   (ostream *)
                   (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HTML::TAG::text((TAG *)&a_1.super_TAG.m_stream);
      std::operator<<((ostream *)
                      (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),
                      "Are you sure you want to reset session ");
      HTML::A::A((A *)local_ef8,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HttpMessage::getParameterString_abi_cxx11_(&local_f38,request);
      std::operator+(&local_f18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,
                     &local_f38);
      pTVar4 = &HTML::A::href((A *)local_ef8,&local_f18)->super_TAG;
      SessionID::toString_abi_cxx11_((string *)&center_2.super_TAG.m_stream,(SessionID *)&pSession);
      HTML::TAG::text(pTVar4,(string *)&center_2.super_TAG.m_stream);
      std::__cxx11::string::~string((string *)&center_2.super_TAG.m_stream);
      std::__cxx11::string::~string((string *)&local_f18);
      std::__cxx11::string::~string((string *)&local_f38);
      HTML::A::~A((A *)local_ef8);
      std::operator<<((ostream *)
                      (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),
                      "?");
      HTML::H2::~H2((H2 *)&a_1.super_TAG.m_stream);
      HTML::CENTER::~CENTER((CENTER *)&h2_1.super_TAG.m_stream);
      HTML::CENTER::CENTER
                ((CENTER *)&a_2.super_TAG.m_stream,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HTML::TAG::text((TAG *)&a_2.super_TAG.m_stream);
      std::operator<<((ostream *)
                      (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),
                      "[");
      HTML::A::A((A *)local_12c8,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HttpMessage::toString_abi_cxx11_(&local_1308,request);
      std::operator+(&local_12e8,&local_1308,"&confirm=1");
      pTVar4 = &HTML::A::href((A *)local_12c8,&local_12e8)->super_TAG;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1328,"YES, reset session",
                 (allocator<char> *)((long)&a_3.super_TAG.m_stream + 7));
      HTML::TAG::text(pTVar4,&local_1328);
      std::__cxx11::string::~string((string *)&local_1328);
      std::allocator<char>::~allocator((allocator<char> *)((long)&a_3.super_TAG.m_stream + 7));
      std::__cxx11::string::~string((string *)&local_12e8);
      std::__cxx11::string::~string((string *)&local_1308);
      HTML::A::~A((A *)local_12c8);
      poVar3 = std::operator<<((ostream *)
                               (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count +
                               0x10),"]");
      poVar3 = std::operator<<(poVar3,HTML::NBSP);
      std::operator<<(poVar3,"[");
      HTML::A::A((A *)local_14e8,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      pTVar4 = &HTML::A::href((A *)local_14e8,(string *)local_388)->super_TAG;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1508,"NO, do not reset session",(allocator<char> *)((long)&e + 7))
      ;
      HTML::TAG::text(pTVar4,&local_1508);
      std::__cxx11::string::~string((string *)&local_1508);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
      HTML::A::~A((A *)local_14e8);
      std::operator<<((ostream *)
                      (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),
                      "]");
      HTML::CENTER::~CENTER((CENTER *)&a_2.super_TAG.m_stream);
    }
    else {
      poVar3 = std::operator<<((ostream *)(h + 0x10),"<META http-equiv=\'refresh\' content=2;URL=\'"
                              );
      poVar3 = std::operator<<(poVar3,"/session");
      HttpMessage::getParameterString_abi_cxx11_
                ((string *)&center.super_TAG.m_stream,(HttpMessage *)local_78);
      poVar3 = std::operator<<(poVar3,(string *)&center.super_TAG.m_stream);
      std::operator<<(poVar3,"\'>");
      std::__cxx11::string::~string((string *)&center.super_TAG.m_stream);
      HTML::CENTER::CENTER
                ((CENTER *)&h2.super_TAG.m_stream,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HTML::TAG::text((TAG *)&h2.super_TAG.m_stream);
      HTML::H2::H2((H2 *)&a.super_TAG.m_stream,
                   (ostream *)
                   (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HTML::TAG::text((TAG *)&a.super_TAG.m_stream);
      HTML::A::A((A *)local_970,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HttpMessage::getParameterString_abi_cxx11_(&local_9b0,(HttpMessage *)local_78);
      std::operator+(&local_990,"/session",&local_9b0);
      pTVar4 = &HTML::A::href((A *)local_970,&local_990)->super_TAG;
      SessionID::toString_abi_cxx11_((string *)&center_1.super_TAG.m_stream,(SessionID *)&pSession);
      HTML::TAG::text(pTVar4,(string *)&center_1.super_TAG.m_stream);
      std::__cxx11::string::~string((string *)&center_1.super_TAG.m_stream);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_9b0);
      HTML::A::~A((A *)local_970);
      std::operator<<((ostream *)
                      (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),
                      " has been reset");
      HTML::H2::~H2((H2 *)&a.super_TAG.m_stream);
      HTML::CENTER::~CENTER((CENTER *)&h2.super_TAG.m_stream);
    }
    std::__cxx11::string::~string((string *)local_388);
    SessionID::~SessionID((SessionID *)&pSession);
    std::__cxx11::string::~string((string *)local_180);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_a8);
    HttpMessage::~HttpMessage((HttpMessage *)local_78);
    return;
  }
  sessionUrl.field_2._M_local_buf[0xe] = '\x01';
  this_00 = (SessionNotFound *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"",(allocator<char> *)(sessionUrl.field_2._M_local_buf + 0xf));
  SessionNotFound::SessionNotFound(this_00,&local_360);
  sessionUrl.field_2._M_local_buf[0xe] = '\0';
  __cxa_throw(this_00,&SessionNotFound::typeinfo,SessionNotFound::~SessionNotFound);
}

Assistant:

void HttpConnection::processResetSession
( const HttpMessage& request, std::stringstream& h, std::stringstream& b )
{
  try
  {
    HttpMessage copy = request;
    std::string beginString = request.getParameter( "BeginString" );
    std::string senderCompID = request.getParameter( "SenderCompID" );
    std::string targetCompID = request.getParameter( "TargetCompID" );
    std::string sessionQualifier;
    if( copy.hasParameter("SessionQualifier") )
      sessionQualifier = copy.getParameter( "SessionQualifier" );

    SessionID sessionID( beginString, senderCompID, targetCompID, sessionQualifier );
    Session* pSession = Session::lookupSession( sessionID );
    if( pSession == 0 ) throw SessionNotFound();

    std::string sessionUrl = "/session" + request.getParameterString();

    bool confirm = false;
    if( copy.hasParameter("confirm") && copy.getParameter("confirm") != "0" )
    {
      confirm = true;
      pSession->reset();
      copy.removeParameter("confirm");
    }

    if( confirm )
    {
      h << "<META http-equiv='refresh' content=2;URL='" << "/session" << copy.getParameterString() << "'>";
      CENTER center(b); center.text();
      H2 h2(b); h2.text();
      { A a(b); a.href("/session" + copy.getParameterString()).text(sessionID.toString()); }
      b << " has been reset";
    }
    else
    {
      { CENTER center(b); center.text();
        H2 h2(b); h2.text();
        b << "Are you sure you want to reset session ";
        { A a(b); a.href(sessionUrl + request.getParameterString()).text(sessionID.toString()); }
        b << "?";
      }
      { CENTER center(b); center.text();
        b << "[";
        { A a(b); a.href(request.toString() + "&confirm=1").text("YES, reset session"); }
        b << "]" << NBSP << "[";
        { A a(b); a.href(sessionUrl).text("NO, do not reset session"); }
        b << "]";
      }
    }
  }
  catch( std::exception& e )
  {
    b << e.what();
  }
}